

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O1

int flatcc_json_printer_table_as_root
              (flatcc_json_printer_t *ctx,void *buf,size_t bufsiz,char *fid,
              flatcc_json_printer_table_f *pf)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  size_t __n;
  size_t __n_00;
  flatcc_json_printer_table_descriptor_t local_38;
  
  accept_header(ctx,buf,bufsiz,fid);
  uVar1 = *buf;
  local_38.table = (void *)((long)buf + (ulong)uVar1);
  ctx->level = ctx->level + 1;
  pcVar4 = ctx->p;
  ctx->p = pcVar4 + 1;
  *pcVar4 = '{';
  local_38.ttl = 99;
  local_38.count = 0;
  local_38.vtable = (void *)((long)local_38.table - (long)*(int *)((long)buf + (ulong)uVar1));
  local_38.vsize = (int)*local_38.vtable;
  (*pf)(ctx,&local_38);
  if (ctx->indent != '\0') {
    pcVar4 = ctx->p;
    ctx->p = pcVar4 + 1;
    *pcVar4 = '\n';
    lVar3 = (long)ctx->level + -1;
    ctx->level = (int)lVar3;
    __n = (ulong)ctx->indent * lVar3;
    pcVar4 = ctx->p;
    if (ctx->pflush < pcVar4 + __n) {
      if (ctx->pflush <= pcVar4) {
        (*ctx->flush)(ctx,0);
      }
      __n_00 = (long)ctx->pflush - (long)ctx->p;
      if (__n_00 < __n) {
        do {
          memset(ctx->p,0x20,__n_00);
          ctx->p = ctx->p + __n_00;
          __n = __n - __n_00;
          (*ctx->flush)(ctx,0);
          __n_00 = (long)ctx->pflush - (long)ctx->p;
        } while (__n_00 < __n);
      }
      pcVar4 = ctx->p;
    }
    memset(pcVar4,0x20,__n);
    ctx->p = ctx->p + __n;
  }
  pcVar4 = ctx->p;
  ctx->p = pcVar4 + 1;
  *pcVar4 = '}';
  if ((ctx->indent != '\0') && (ctx->level == 0)) {
    pcVar4 = ctx->p;
    ctx->p = pcVar4 + 1;
    *pcVar4 = '\n';
  }
  (*ctx->flush)(ctx,1);
  iVar2 = -1;
  if (ctx->error == 0) {
    iVar2 = (*(int *)&ctx->p - *(int *)&ctx->buf) + (int)ctx->total;
  }
  return iVar2;
}

Assistant:

int flatcc_json_printer_table_as_root(flatcc_json_printer_t *ctx,
        const void *buf, size_t bufsiz, const char *fid, flatcc_json_printer_table_f *pf)
{
    if (!accept_header(ctx, buf, bufsiz, fid)) {
        return -1;
    }
    print_table_object(ctx, read_uoffset_ptr(buf), FLATCC_JSON_PRINT_MAX_LEVELS, pf);
    print_last_nl();
    return flatcc_json_printer_get_error(ctx) ? -1 : (int)ctx->total + (int)(ctx->p - ctx->buf);
}